

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CloseCurrentPopup(void)

{
  uint uVar1;
  ImGuiPopupRef *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  uint uVar6;
  uint remaining;
  
  pIVar4 = GImGui;
  uVar5 = (GImGui->BeginPopupStack).Size;
  if ((0 < (int)uVar5) && ((int)uVar5 <= (GImGui->OpenPopupStack).Size)) {
    uVar6 = uVar5 - 1;
    pIVar2 = (GImGui->OpenPopupStack).Data;
    if ((GImGui->BeginPopupStack).Data[uVar6].PopupId == pIVar2[uVar6].PopupId) {
      remaining = 0;
      if (uVar5 != 1) {
        do {
          uVar1 = uVar5 - 1;
          pIVar3 = pIVar2[uVar1].Window;
          remaining = uVar6;
          if (pIVar3 == (ImGuiWindow *)0x0) break;
          if ((pIVar3->Flags & 0x10000000) == 0) {
            remaining = uVar5 - 1;
            break;
          }
          uVar6 = uVar6 - 1;
          uVar5 = uVar1;
          remaining = 0;
        } while (1 < (int)uVar1);
      }
      ClosePopupToLevel(remaining,true);
      if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar4->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;
    while (popup_idx > 0 && g.OpenPopupStack[popup_idx].Window && (g.OpenPopupStack[popup_idx].Window->Flags & ImGuiWindowFlags_ChildMenu))
        popup_idx--;
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}